

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int wb_write_to_temp(archive_write *a,void *buff,size_t s)

{
  int iVar1;
  uchar *__dest;
  void *in_RDX;
  archive_write *in_RSI;
  archive_write *in_RDI;
  size_t size;
  iso9660_conflict *iso9660;
  size_t xs;
  char *xp;
  void *__n;
  archive_write *in_stack_ffffffffffffffc8;
  void *local_30;
  
  local_30 = in_RDX;
  if ((*(long *)((long)in_RDI->format_data + 0x102e0) == 0x10000) && ((void *)0x4000 < in_RDX)) {
    in_stack_ffffffffffffffc8 = (archive_write *)in_RDI->format_data;
    local_30 = (void *)((ulong)in_RDX & 0x7ff);
    in_stack_ffffffffffffffc8[0xec].format_data =
         (void *)(((long)in_RDX - (long)local_30) +
                 (long)in_stack_ffffffffffffffc8[0xec].format_data);
    iVar1 = write_to_temp(in_RSI,in_RDX,(size_t)in_RSI);
    if (iVar1 != 0) {
      return -0x1e;
    }
    if (local_30 == (void *)0x0) {
      return 0;
    }
    in_RSI = (archive_write *)(((long)in_RDX - (long)local_30) + (long)in_RSI);
  }
  while( true ) {
    if (local_30 == (void *)0x0) {
      return 0;
    }
    __n = local_30;
    if (*(void **)((long)in_RDI->format_data + 0x102e0) < local_30) {
      __n = *(void **)((long)in_RDI->format_data + 0x102e0);
    }
    __dest = wb_buffptr(in_RDI);
    memcpy(__dest,in_RSI,(size_t)__n);
    iVar1 = wb_consume(in_stack_ffffffffffffffc8,(size_t)__n);
    if (iVar1 != 0) break;
    local_30 = (void *)((long)local_30 - (long)__n);
    in_RSI = (archive_write *)((long)__n + (long)in_RSI);
  }
  return -0x1e;
}

Assistant:

static int
wb_write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	const char *xp = buff;
	size_t xs = s;

	/*
	 * If a written data size is big enough to use system-call
	 * and there is no waiting data, this calls write_to_temp() in
	 * order to reduce a extra memory copy.
	 */
	if (wb_remaining(a) == wb_buffmax() && s > (1024 * 16)) {
		struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;
		xs = s % LOGICAL_BLOCK_SIZE;
		iso9660->wbuff_offset += s - xs;
		if (write_to_temp(a, buff, s - xs) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		if (xs == 0)
			return (ARCHIVE_OK);
		xp += s - xs;
	}

	while (xs) {
		size_t size = xs;
		if (size > wb_remaining(a))
			size = wb_remaining(a);
		memcpy(wb_buffptr(a), xp, size);
		if (wb_consume(a, size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		xs -= size;
		xp += size;
	}
	return (ARCHIVE_OK);
}